

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int plane_partition_num(int n)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined4 *puVar4;
  int local_24;
  int value;
  int s2;
  int *pp;
  int nn;
  int k;
  int j;
  int n_local;
  
  if (n < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"PLANE_PARTITION_NUM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  0 <= N is required.\n");
    exit(1);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(n + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (undefined4 *)operator_new__(uVar3);
  *puVar4 = 1;
  if (0 < n) {
    puVar4[1] = 1;
  }
  for (pp._0_4_ = 2; (int)pp <= n; pp._0_4_ = (int)pp + 1) {
    puVar4[(int)pp] = 0;
    for (nn = 1; nn <= (int)pp; nn = nn + 1) {
      local_24 = 0;
      for (pp._4_4_ = 1; pp._4_4_ <= nn; pp._4_4_ = pp._4_4_ + 1) {
        if (nn % pp._4_4_ == 0) {
          local_24 = local_24 + pp._4_4_ * pp._4_4_;
        }
      }
      puVar4[(int)pp] = puVar4[(int)pp] + puVar4[(int)pp - nn] * local_24;
    }
    puVar4[(int)pp] = (int)puVar4[(int)pp] / (int)pp;
  }
  iVar1 = puVar4[n];
  if (puVar4 != (undefined4 *)0x0) {
    operator_delete__(puVar4);
  }
  return iVar1;
}

Assistant:

int plane_partition_num ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    PLANE_PARTITION_NUM returns the number of plane partitions of the integer N.
//
//  Discussion:
//
//    A plane partition of a positive integer N is a partition of N in which
//    the parts have been arranged in a 2D array that is nonincreasing across
//    rows and columns.  There are six plane partitions of 3:
//
//      3   2 1   2   1 1 1   1 1   1
//                1           1     1
//                                  1
//
//  First Values:
//
//     N PP(N)
//     0    1
//     1    1
//     2    3
//     3    6
//     4   13
//     5   24
//     6   48
//     7   86
//     8  160
//     9  282
//    10  500
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Frank Olver, Daniel Lozier, Ronald Boisvert, Charles Clark,
//    NIST Handbook of Mathematical Functions,
//    Cambridge University Press, 2010,
//    ISBN: 978-0521140638,
//    LC: QA331.N57.
//  
//  Parameters:
//
//    Input, int N, the number, which must be at least 0.
//
//    Output, int PLANE_PARTITION_NUM, the number of 
//    plane partitions of N.
//
{
  int j;
  int k;
  int nn;
  int *pp;
  int s2;
  int value;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "PLANE_PARTITION_NUM - Fatal error!\n";
    std::cerr << "  0 <= N is required.\n";
    exit ( 1 );
  }

  pp = new int[n+1];
  nn = 0;
  pp[nn] = 1;

  nn = 1;
  if ( nn <= n )
  {
    pp[nn] = 1;
  }

  for ( nn = 2; nn <= n; nn++ )
  {
    pp[nn] = 0;
    for ( j = 1; j <= nn; j++ )
    {
      s2 = 0;
      for ( k = 1; k <= j; k++ )
      {
        if ( ( j % k ) == 0 )
        {
          s2 = s2 + k * k;
        }
      }
      pp[nn] = pp[nn] + pp[nn-j] * s2;
    }
    pp[nn] = pp[nn] / nn;
  }

  value = pp[n];

  delete [] pp;

  return value;
}